

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  char *pcVar2;
  element_type *this;
  unique_lock<pstore::file::range_lock> *this_00;
  double __x;
  char *what;
  exception *ex;
  not_null<const_char_*> local_190;
  quoted local_188;
  status *local_180;
  reference_wrapper<std::unique_lock<pstore::file::range_lock>_> local_178;
  thread local_170;
  thread watch_th;
  status *local_160;
  thread local_158;
  thread copy_th;
  unique_lock<pstore::file::range_lock> *file_lock;
  thread quit_th;
  status st;
  shared_ptr<pstore::database> src_db;
  quoted local_118;
  path local_110 [8];
  string src_dir;
  string local_f0 [8];
  string src_path;
  undefined1 local_c8 [64];
  undefined1 local_88 [8];
  user_options user_opt;
  string local_58 [48];
  not_null<const_char_*> local_28;
  int local_1c;
  char **ppcStack_18;
  int exit_code;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_1c = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  pstore::gsl::not_null<const_char_*>::not_null(&local_28,"main");
  pstore::threads::set_name(local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"vacuumd",(allocator *)&user_opt.field_0x27);
  pstore::create_log_stream((string *)local_58);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&user_opt.field_0x27);
  vacuum::user_options::user_options((user_options *)local_88);
  get_switches((pair<vacuum::user_options,_int> *)(local_c8 + 0x10),(int)argv_local,ppcStack_18);
  std::tie<vacuum::user_options,int>((user_options *)local_c8,(int *)local_88);
  std::tuple<vacuum::user_options&,int&>::operator=
            ((tuple<vacuum::user_options&,int&> *)local_c8,
             (pair<vacuum::user_options,_int> *)(local_c8 + 0x10));
  std::pair<vacuum::user_options,_int>::~pair((pair<vacuum::user_options,_int> *)(local_c8 + 0x10));
  if (local_1c == 0) {
    std::__cxx11::string::string(local_f0,(string *)&user_opt);
    pstore::path::dir_name(local_110,(string *)local_f0);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pstore::gsl::not_null<const_char_*>::not_null
              ((not_null<const_char_*> *)
               &src_db.super___shared_ptr<pstore::database,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               pcVar2);
    pstore::logger::quoted::quoted
              (&local_118,
               (not_null<const_char_*>)
               src_db.super___shared_ptr<pstore::database,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    pstore::log<pstore::logger::quoted>(notice,"Start ",local_118);
    quit_th._M_id._M_thread._4_4_ = 1;
    quit_th._M_id._M_thread._3_1_ = 0;
    std::
    make_shared<pstore::database,std::__cxx11::string_const&,pstore::database::access_mode,bool>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&st,
               (access_mode *)local_f0,(bool *)((long)&quit_th._M_id._M_thread + 4));
    vacuum::status::status((status *)&quit_th);
    create_quit_thread((status *)&file_lock,(shared_ptr<pstore::database> *)&quit_th);
    this = std::__shared_ptr_access<pstore::database,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pstore::database,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&st);
    this_00 = pstore::database::upgrade_to_write_lock(this);
    if (this_00 == (unique_lock<pstore::file::range_lock> *)0x0) {
      pstore::assert_failed
                ("0",
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/tools/vacuum/main.cpp"
                 ,0x7c);
    }
    bVar1 = std::unique_lock<pstore::file::range_lock>::try_lock(this_00);
    if (bVar1) {
      pstore::gsl::not_null<const_char_*>::not_null
                ((not_null<const_char_*> *)&copy_th,"Got the file lock. No-one has the file open.");
      pstore::log((pstore *)0x6,__x);
      std::unique_lock<pstore::file::range_lock>::unlock(this_00);
    }
    local_160 = (status *)&quit_th;
    watch_th._M_id._M_thread = (id)std::ref<vacuum::user_options>((user_options *)local_88);
    std::thread::
    thread<void(&)(std::shared_ptr<pstore::database>,vacuum::status*,vacuum::user_options_const&),std::shared_ptr<pstore::database>&,vacuum::status*,std::reference_wrapper<vacuum::user_options>,void>
              (&local_158,vacuum::copy,(shared_ptr<pstore::database> *)&st,&local_160,
               (reference_wrapper<vacuum::user_options> *)&watch_th);
    local_178 = std::ref<std::unique_lock<pstore::file::range_lock>>(this_00);
    local_180 = (status *)&quit_th;
    std::thread::
    thread<void(&)(std::shared_ptr<pstore::database>,std::unique_lock<pstore::file::range_lock>&,vacuum::status*),std::shared_ptr<pstore::database>&,std::reference_wrapper<std::unique_lock<pstore::file::range_lock>>,vacuum::status*,void>
              (&local_170,vacuum::watch,(shared_ptr<pstore::database> *)&st,&local_178,&local_180);
    std::__shared_ptr<pstore::database,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<pstore::database,_(__gnu_cxx::_Lock_policy)2> *)&st);
    std::thread::join();
    std::thread::join();
    notify_quit_thread();
    std::thread::join();
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pstore::gsl::not_null<const_char_*>::not_null(&local_190,pcVar2);
    pstore::logger::quoted::quoted(&local_188,local_190);
    pstore::log<pstore::logger::quoted>(notice,"main () exiting: ",local_188);
    std::thread::~thread(&local_170);
    std::thread::~thread(&local_158);
    std::thread::~thread((thread *)&file_lock);
    std::shared_ptr<pstore::database>::~shared_ptr((shared_ptr<pstore::database> *)&st);
    std::__cxx11::string::~string((string *)local_110);
    std::__cxx11::string::~string(local_f0);
    bVar1 = false;
  }
  else {
    argv_local._4_4_ = local_1c;
    bVar1 = true;
  }
  vacuum::user_options::~user_options((user_options *)local_88);
  if (!bVar1) {
    argv_local._4_4_ = local_1c;
  }
  return argv_local._4_4_;
}

Assistant:

int main (int argc, char * argv[]) {
#endif
    int exit_code = EXIT_SUCCESS;
    using priority = pstore::logger::priority;
    PSTORE_TRY {
        pstore::threads::set_name ("main");
        pstore::create_log_stream ("vacuumd");

        vacuum::user_options user_opt;
        std::tie (user_opt, exit_code) = get_switches (argc, argv);
        if (exit_code != EXIT_SUCCESS) {
            return exit_code;
        }

#if 0
        if (user_opt.daemon_mode) {
#    ifdef _WIN32
            if (::SetPriorityClass (::GetCurrentProcess (), PROCESS_MODE_BACKGROUND_BEGIN) == 0) {
                throw pstore::win32::exception ("SetPriorityClass", ::GetLastError ());
            }
#    else
            // Increase our "niceness" value to reduce the priority of the process.
            if (::setpriority (PRIO_PROCESS, 0, 7) == -1) {
                raise (pstore::errno_erc {errno}, "setpriority");
            }
            if (daemon (0 /*nochdir*/, 0 /*noclose*/) != 0) {
                raise (pstore::errno_erc {errno}, "daemon");
            }
#    endif
        }
#endif

        // bool const verbose = (options [verbose_opt] != nullptr);
        std::string const src_path = user_opt.src_path;
        std::string const src_dir = pstore::path::dir_name (src_path);

        log (priority::notice, "Start ", pstore::logger::quoted{src_path.c_str ()});

        // Superficially, we shouldn't need write access to the data store, but we do so because
        // once the collection is complete, we'll rename the temporary file that has been created
        // to the real file name that we're replacing. If the target file isn't writable, we
        // shouldn't try to replace it with the newer version.
        auto src_db = std::make_shared<pstore::database> (
            src_path, pstore::database::access_mode::writable, false /*access tick enabled*/);

        vacuum::status st;
        std::thread quit_th = create_quit_thread (st, src_db);

        std::unique_lock<pstore::file::range_lock> * file_lock = src_db->upgrade_to_write_lock ();
        if (file_lock == nullptr) {
            PSTORE_ASSERT (0);
        }

        if (file_lock->try_lock ()) {
            log (priority::info, "Got the file lock. No-one has the file open.");
            file_lock->unlock ();
        }

        std::thread copy_th (vacuum::copy, src_db, &st, std::ref (user_opt));
        std::thread watch_th (vacuum::watch, src_db, std::ref (*file_lock), &st);

        src_db.reset (); // main thread releases its reference to the source database.

        copy_th.join ();
        watch_th.join ();

        // We're done. Ask the quit thread to exit.
        notify_quit_thread ();
        quit_th.join ();

        // TODO:
        // On macOS we can do better than rename() [see man 2 exchangedata].
        // Similar elsewhere?

        log (priority::notice, "main () exiting: ", pstore::logger::quoted{src_path.c_str ()});
    }